

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::TransRangeSyntax::setChild(TransRangeSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  TransRepeatRangeSyntax *pTVar2;
  long in_RSI;
  long in_RDI;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_stack_ffffffffffffffd8;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *this_00;
  
  this_00 = (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)&stack0x00000008;
  if (in_RSI == 0) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x52674a);
    SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>>(pSVar1);
    SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::operator=
              (this_00,in_stack_ffffffffffffffd8);
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x52676f);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pTVar2 = (TransRepeatRangeSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x52677f);
      pTVar2 = SyntaxNode::as<slang::syntax::TransRepeatRangeSyntax>(pSVar1);
    }
    *(TransRepeatRangeSyntax **)(in_RDI + 0x50) = pTVar2;
  }
  return;
}

Assistant:

void TransRangeSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: items = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 1: repeat = child.node() ? &child.node()->as<TransRepeatRangeSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}